

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZROT::ContactableGetStateBlock_x
          (ChContactTriangleXYZROT *this,ChState *x)

{
  element_type *peVar1;
  double *pdVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  
  if (2 < (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar2 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar3 = 3;
    if ((((ulong)pdVar2 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar3 = uVar4;
    }
    peVar1 = (this->mnode1).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pdVar2[uVar4] = *(double *)(&(peVar1->super_ChNodeFEAbase).field_0x20 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (uVar3 < 3) {
      do {
        pdVar2[uVar3] = *(double *)(&(peVar1->super_ChNodeFEAbase).field_0x20 + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 3);
    }
    if (6 < (x->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar2 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
      uVar3 = 4;
      if ((((ulong)pdVar2 & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 4)) {
        uVar3 = uVar4;
      }
      peVar1 = (this->mnode1).
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          pdVar2[uVar4] = *(double *)(&peVar1->field_0x38 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar3 < 4) {
        do {
          pdVar2[uVar3] = *(double *)(&peVar1->field_0x38 + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 4);
      }
      if (9 < (x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pdVar2 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 7
        ;
        uVar3 = 3;
        if ((((ulong)pdVar2 & 7) == 0) &&
           (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
          uVar3 = uVar4;
        }
        peVar1 = (this->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            pdVar2[uVar4] = *(double *)(&(peVar1->super_ChNodeFEAbase).field_0x20 + uVar4 * 8);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        if (uVar3 < 3) {
          do {
            pdVar2[uVar3] = *(double *)(&(peVar1->super_ChNodeFEAbase).field_0x20 + uVar3 * 8);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        if (0xd < (x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pdVar2 = (x->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   10;
          uVar3 = 4;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 4)) {
            uVar3 = uVar4;
          }
          peVar1 = (this->mnode2).
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              pdVar2[uVar4] = *(double *)(&peVar1->field_0x38 + uVar4 * 8);
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          if (uVar3 < 4) {
            do {
              pdVar2[uVar3] = *(double *)(&peVar1->field_0x38 + uVar3 * 8);
              uVar3 = uVar3 + 1;
            } while (uVar3 != 4);
          }
          if (0x10 < (x->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            pdVar2 = (x->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + 0xe;
            uVar3 = 3;
            if ((((ulong)pdVar2 & 7) == 0) &&
               (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
              uVar3 = uVar4;
            }
            peVar1 = (this->mnode3).
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (uVar3 != 0) {
              uVar4 = 0;
              do {
                pdVar2[uVar4] = *(double *)(&(peVar1->super_ChNodeFEAbase).field_0x20 + uVar4 * 8);
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
            }
            if (uVar3 < 3) {
              do {
                pdVar2[uVar3] = *(double *)(&(peVar1->super_ChNodeFEAbase).field_0x20 + uVar3 * 8);
                uVar3 = uVar3 + 1;
              } while (uVar3 != 3);
            }
            if (0x14 < (x->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows) {
              pdVar2 = (x->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + 0x11;
              uVar3 = 4;
              if ((((ulong)pdVar2 & 7) == 0) &&
                 (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 4)) {
                uVar3 = uVar4;
              }
              peVar1 = (this->mnode3).
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (uVar3 != 0) {
                uVar4 = 0;
                do {
                  pdVar2[uVar4] = *(double *)(&peVar1->field_0x38 + uVar4 * 8);
                  uVar4 = uVar4 + 1;
                } while (uVar3 != uVar4);
              }
              if (uVar3 < 4) {
                do {
                  pdVar2[uVar3] = *(double *)(&peVar1->field_0x38 + uVar3 * 8);
                  uVar3 = uVar3 + 1;
                } while (uVar3 != 4);
              }
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChContactTriangleXYZROT::ContactableGetStateBlock_x(ChState& x) {
    x.segment(0, 3) = mnode1->GetPos().eigen();
    x.segment(3, 4) = mnode1->GetRot().eigen();

    x.segment(7, 3) = mnode2->GetPos().eigen();
    x.segment(10, 4) = mnode2->GetRot().eigen();

    x.segment(14, 3) = mnode3->GetPos().eigen();
    x.segment(17, 4) = mnode3->GetRot().eigen();
}